

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution_x86::forward(Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int kernel_h;
  int iVar1;
  _func_int *p_Var2;
  size_t _elemsize;
  Layer *pLVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Convolution *pCVar10;
  Mat local_78;
  
  if (bottom_blob->dims == 3) {
    p_Var2 = this->_vptr_Convolution_x86[-3];
    if ((opt->use_int8_inference == true) && (*(long *)(&this->field_0x148 + (long)p_Var2) == 1)) {
      iVar5 = forward_int8_x86(this,bottom_blob,top_blob,opt);
      return iVar5;
    }
    pCVar10 = (Convolution *)((long)&this->_vptr_Convolution_x86 + (long)p_Var2);
    iVar5 = *(int *)(p_Var2 + 4 + (long)&(this->weight_3x3_winograd23_data_int8).data);
    if (((iVar5 < 2) && (iVar9 = pCVar10->dilation_h, pCVar10->dilation_h < 2)) ||
       (((pCVar10->stride_w < 2 && (pCVar10->stride_h < 2)) &&
        ((iVar7 = pCVar10->dilation_h, iVar9 = iVar7, iVar7 < 2 && iVar5 < 2 ||
         (iVar9 = iVar5, iVar5 == iVar7)))))) {
      _elemsize = bottom_blob->elemsize;
      iVar7 = pCVar10->kernel_w;
      iVar8 = pCVar10->kernel_h;
      local_78.elemsize._0_4_ = 0;
      local_78._20_8_ = 0;
      local_78.data = (void *)0x0;
      local_78.refcount._0_4_ = 0;
      local_78.refcount._4_4_ = 0;
      local_78.allocator = (Allocator *)0x0;
      local_78.dims = 0;
      local_78.w = 0;
      local_78.h = 0;
      local_78.c = 0;
      local_78.cstep = 0;
      Convolution::make_padding
                ((Convolution *)
                 ((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-3]),
                 bottom_blob,&local_78,opt);
      iVar6 = -100;
      if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
        p_Var2 = this->_vptr_Convolution_x86[-3];
        iVar5 = (~((iVar7 + -1) * iVar5) + local_78.w) /
                *(int *)(p_Var2 + 0xc + (long)&(this->weight_3x3_winograd23_data_int8).data);
        iVar7 = iVar5 + 1;
        iVar9 = (~((iVar8 + -1) * iVar9) + local_78.h) /
                *(int *)(p_Var2 + 0x10 + (long)&(this->weight_3x3_winograd23_data_int8).data);
        iVar8 = iVar9 + 1;
        Mat::create(top_blob,iVar7,iVar8,*(int *)(&this->use_winograd3x3_int8 + (long)p_Var2),
                    _elemsize,opt->blob_allocator);
        iVar6 = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          p_Var2 = this->_vptr_Convolution_x86[-3];
          pCVar10 = (Convolution *)((long)&this->_vptr_Convolution_x86 + (long)p_Var2);
          iVar6 = *(int *)(&this->field_0xbc + (long)p_Var2);
          kernel_h = *(int *)(p_Var2 + (long)&(this->weight_3x3_winograd23_data_int8).data);
          if ((((iVar6 == kernel_h) && (iVar1 = pCVar10->dilation_w, iVar1 != 1)) &&
              (pCVar10->dilation_h == iVar1)) &&
             ((pCVar10->stride_w == 1 && (pCVar10->stride_h == 1)))) {
            if ((iVar7 < iVar1) || (iVar8 < iVar1)) {
              iVar6 = Convolution::forward(pCVar10,bottom_blob,top_blob,opt);
            }
            else {
              iVar6 = forwardDilation_x86(this,&local_78,top_blob,opt);
            }
          }
          else {
            if ((kernel_h == 3 && iVar6 == 3) &&
               (((pCVar10->dilation_w == 1 && (pCVar10->dilation_h == 1)) &&
                ((pCVar10->stride_w == 1 && (pCVar10->stride_h == 1)))))) {
              if (((iVar9 < 7) || (iVar5 < 7)) || (this->use_winograd3x3 == false)) {
                conv_im2col_sgemm_sse
                          (&local_78,top_blob,&this->weight_sgemm_data,
                           (Mat *)(pCVar10->bias_data).data,3,3,1,1,opt);
              }
              else {
                conv3x3s1_winograd23_sse
                          (&local_78,top_blob,&this->weight_3x3_winograd23_data,&pCVar10->bias_data,
                           opt);
              }
            }
            else {
              conv_im2col_sgemm_sse
                        (&local_78,top_blob,&this->weight_sgemm_data,
                         (Mat *)(pCVar10->bias_data).data,iVar6,kernel_h,pCVar10->stride_w,
                         pCVar10->stride_h,opt);
            }
            pLVar3 = this->activation;
            if (pLVar3 != (Layer *)0x0) {
              (*pLVar3->_vptr_Layer[9])(pLVar3,top_blob,opt);
            }
            iVar6 = 0;
          }
        }
      }
      piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            if (local_78.data != (void *)0x0) {
              free(local_78.data);
            }
          }
          else {
            (**(code **)(*(long *)local_78.allocator + 0x18))();
          }
        }
      }
      return iVar6;
    }
  }
  else {
    pCVar10 = (Convolution *)
              ((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-3]);
  }
  iVar5 = Convolution::forward(pCVar10,bottom_blob,top_blob,opt);
  return iVar5;
}

Assistant:

int Convolution_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    if (bottom_blob.dims != 3)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }

    if ((dilation_w > 1 || dilation_h > 1) && (stride_w > 1 || stride_h > 1))
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    if ((dilation_w > 1 || dilation_h > 1) && dilation_w != dilation_h)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // float32
    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        if (outw < dilation_w || outh < dilation_h)
        {
            return Convolution::forward(bottom_blob, top_blob, opt);
        }

        return forwardDilation_x86(bottom_blob_bordered, top_blob, opt);
    }

    if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if (use_winograd3x3 && outw >= 8 && outh >=8)
        {
            conv3x3s1_winograd23_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data, bias_data, opt);
//             conv3x3s1_winograd43_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd43_data, bias_data, opt);
        }
        else
        {
            conv_im2col_sgemm_sse(bottom_blob_bordered, top_blob, weight_sgemm_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, opt);
        }

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }
    else
    {
//         conv1x1s1_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
//         conv1x1s2_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
//         conv3x3s1_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
//         conv3x3s2_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
//         conv5x5s1_neon(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);

        conv_im2col_sgemm_sse(bottom_blob_bordered, top_blob, weight_sgemm_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, opt);

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }

    return 0;
}